

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

void __thiscall
boost::xpressive::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~match_results(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this)

{
  std::
  vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ::~vector(&this->named_marks_);
  std::
  _Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_void_*>,_std::_Select1st<std::pair<const_std::type_info_*const,_void_*>_>,_boost::xpressive::detail::type_info_less,_std::allocator<std::pair<const_std::type_info_*const,_void_*>_>_>
  ::~_Rb_tree(&(this->args_)._M_t);
  intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::~intrusive_ptr(&this->traits_);
  intrusive_ptr<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr(&this->extras_ptr_);
  detail::
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~list(&(this->nested_results_).
           super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         );
  if ((this->suffix_).super_type.m_initialized == true) {
    (this->suffix_).super_type.m_initialized = false;
  }
  if ((this->prefix_).super_type.m_initialized == true) {
    (this->prefix_).super_type.m_initialized = false;
  }
  if ((this->base_).super_type.m_initialized == true) {
    (this->base_).super_type.m_initialized = false;
  }
  return;
}

Assistant:

~match_results()
    {
    }